

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  _Bool _Var1;
  bitset_container_t *bitset;
  undefined1 in_CL;
  uint32_t in_EDX;
  uint32_t in_ESI;
  container_t *in_RDI;
  undefined3 in_stack_ffffffffffffffe4;
  uint range_start_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  range_start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffe4);
  bitset = (bitset_container_t *)container_unwrap_shared(in_RDI,&stack0xffffffffffffffe7);
  if (range_start_00 >> 0x18 == 1) {
    _Var1 = bitset_container_get_range(bitset,in_ESI,in_EDX);
  }
  else if (range_start_00 >> 0x18 == 2) {
    _Var1 = array_container_contains_range
                      ((array_container_t *)CONCAT44(in_ESI,in_EDX),range_start_00,2);
  }
  else {
    _Var1 = run_container_contains_range
                      ((run_container_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint32_t)((ulong)bitset >> 0x20),(uint32_t)bitset);
  }
  return _Var1;
}

Assistant:

static inline bool container_contains_range(
    const container_t *c, uint32_t range_start, uint32_t range_end,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get_range(const_CAST_bitset(c), range_start,
                                              range_end);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains_range(const_CAST_array(c),
                                                  range_start, range_end);
        case RUN_CONTAINER_TYPE:
            return run_container_contains_range(const_CAST_run(c), range_start,
                                                range_end);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}